

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O0

void __thiscall
markdown::token::HtmlAnchorTag::HtmlAnchorTag(HtmlAnchorTag *this,string *url,string *title)

{
  ulong uVar1;
  bool local_132;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *title_local;
  string *url_local;
  HtmlAnchorTag *this_local;
  
  local_20 = title;
  title_local = url;
  url_local = (string *)this;
  anon_unknown_0::encodeString(&local_c0,url,9);
  std::operator+(&local_a0,"<a href=\"",&local_c0);
  std::operator+(&local_80,&local_a0,"\"");
  uVar1 = std::__cxx11::string::empty();
  local_132 = (uVar1 & 1) != 0;
  if (local_132) {
    std::__cxx11::string::string((string *)&local_f0);
  }
  else {
    anon_unknown_0::encodeString(&local_130,local_20,9);
    std::operator+(&local_110," title=\"",&local_130);
    std::operator+(&local_f0,&local_110,"\"");
  }
  local_132 = !local_132;
  std::operator+(&local_60,&local_80,&local_f0);
  std::operator+(&local_40,&local_60,">");
  TextHolder::TextHolder(&this->super_TextHolder,&local_40,false,0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_f0);
  if (local_132) {
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  (this->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__HtmlAnchorTag_001fb910;
  return;
}

Assistant:

HtmlAnchorTag::HtmlAnchorTag(const std::string& url, const std::string& title):
	TextHolder("<a href=\""+encodeString(url, cQuotes|cAmps)+"\""
		+(title.empty() ? std::string() : " title=\""+encodeString(title, cQuotes|cAmps)+"\"")
		+">", false, 0)
{
	// This space deliberately blank. ;-)
}